

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_scopy_to_ucol.c
# Opt level: O3

int ilu_scopy_to_ucol(int jcol,int nseg,int *segrep,int *repfnz,int *perm_r,float *dense,
                     int drop_rule,milu_t milu,double drop_tol,int quota,float *sum,int *nnzUj,
                     GlobalLU_t *Glu,float *work)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  int_t iVar5;
  int_t *piVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int *piVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  void *pvVar16;
  int_t *piVar17;
  long lVar18;
  int *piVar19;
  int_t *piVar20;
  int iVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  double dVar27;
  float fVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  int m;
  int_t nzumax;
  int i_1;
  int local_dc;
  uint local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  ulong local_c8;
  int *local_c0;
  int *local_b8;
  double local_b0;
  ulong local_a8;
  void *local_a0;
  int local_94;
  int local_90;
  integer local_8c;
  long local_88;
  int_t *local_80;
  float *local_78;
  int *local_70;
  ulong local_68;
  int_t *local_60;
  int *local_58;
  int *local_50;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_d8 = nseg;
  local_b8 = segrep;
  local_b0 = drop_tol;
  local_70 = perm_r;
  local_50 = repfnz;
  fVar22 = smach("Safe minimum");
  fVar22 = 1.0 / fVar22;
  local_8c = 1;
  local_58 = Glu->xsup;
  piVar19 = Glu->supno;
  piVar6 = Glu->lsub;
  local_60 = Glu->xlsub;
  pvVar16 = Glu->ucol;
  piVar17 = Glu->usub;
  piVar20 = Glu->xusub;
  local_d4 = Glu->nzumax;
  *sum = 0.0;
  dVar27 = local_b0;
  if (drop_rule == 0) {
    quota = Glu->n;
    dVar27 = -1.0;
  }
  local_a0 = (void *)CONCAT44(local_a0._4_4_,jcol);
  lVar18 = (long)jcol;
  iVar11 = piVar20[lVar18];
  fVar28 = 0.0;
  uVar29 = 0;
  uVar30 = 0;
  iVar21 = iVar11;
  local_c0 = piVar19;
  if (0 < (int)local_d8) {
    iVar21 = piVar19[lVar18];
    uVar10 = (ulong)local_d8;
    uVar9 = 0;
    piVar12 = local_b8;
    uVar14 = local_d8;
    local_d0 = iVar21;
    local_cc = quota;
    local_b0 = dVar27;
    local_88 = lVar18;
    local_80 = piVar20;
    local_78 = dense;
    do {
      iVar1 = piVar12[uVar10 - 1];
      local_c8 = uVar9;
      if ((piVar19[iVar1] != iVar21) && (iVar2 = local_50[iVar1], local_a8 = uVar10, iVar2 != -1)) {
        local_94 = (iVar2 - local_58[piVar19[iVar1]]) + local_60[local_58[piVar19[iVar1]]];
        local_68 = (ulong)(uint)(iVar1 - iVar2);
        iVar21 = iVar11 + (iVar1 - iVar2) + 1;
        local_90 = iVar2;
        local_48 = fVar22;
        fStack_44 = fVar28;
        uStack_40 = uVar29;
        uStack_3c = uVar30;
        if (local_d4 < iVar21) {
          do {
            iVar2 = (int)local_a0;
            iVar5 = sLUMemXpand((int)local_a0,iVar11,UCOL,&local_d4,Glu);
            if (iVar5 != 0) {
              return iVar5;
            }
            pvVar16 = Glu->ucol;
            iVar5 = sLUMemXpand(iVar2,iVar11,USUB,&local_d4,Glu);
            if (iVar5 != 0) {
              return iVar5;
            }
          } while (local_d4 < iVar21);
          piVar6 = Glu->lsub;
          piVar17 = Glu->usub;
        }
        uVar10 = local_a8;
        piVar12 = local_b8;
        piVar19 = local_c0;
        fVar22 = local_48;
        fVar28 = fStack_44;
        uVar29 = uStack_40;
        uVar30 = uStack_3c;
        quota = local_cc;
        uVar14 = local_d8;
        iVar21 = local_d0;
        if (-1 < (int)local_68) {
          lVar18 = 0;
          do {
            iVar2 = piVar6[local_94 + lVar18];
            fVar23 = local_78[iVar2];
            fVar25 = ABS(fVar23);
            if ((local_cc < 1) || ((double)fVar25 < local_b0)) {
              if (milu - SMILU_1 < 2) {
                fVar23 = fVar23 + *sum;
              }
              else {
                if (milu != SMILU_3) goto LAB_0010c91d;
                fVar23 = *sum + fVar25;
              }
              *sum = fVar23;
            }
            else {
              auVar26._0_4_ = ~-(uint)(fVar25 < fVar22) & (uint)fVar22;
              auVar26._4_4_ = ~-(uint)(fVar28 < fVar25) & (uint)fVar28;
              auVar26._8_4_ = uVar29;
              auVar26._12_4_ = uVar30;
              auVar24._4_4_ = (uint)fVar25 & -(uint)(fVar28 < fVar25);
              auVar24._0_4_ = (uint)fVar25 & -(uint)(fVar25 < fVar22);
              auVar24._8_8_ = 0;
              auVar26 = auVar26 | auVar24;
              piVar17[iVar11] = local_70[iVar2];
              *(float *)((long)pvVar16 + (long)iVar11 * 4) = fVar23;
              iVar11 = iVar11 + 1;
              fVar22 = auVar26._0_4_;
              fVar28 = auVar26._4_4_;
              uVar29 = auVar26._8_4_;
              uVar30 = auVar26._12_4_;
            }
LAB_0010c91d:
            local_78[iVar2] = 0.0;
            lVar18 = lVar18 + 1;
          } while ((iVar1 - local_90) + 1 != (int)lVar18);
        }
      }
      uVar10 = uVar10 - 1;
      uVar8 = (int)local_c8 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar8 != uVar14);
    lVar18 = local_88;
    piVar20 = local_80;
    iVar21 = local_80[local_88];
  }
  local_a0 = pvVar16;
  piVar20[lVar18 + 1] = iVar11;
  local_dc = iVar11 - iVar21;
  if (((drop_rule & 0xeU) != 0) && (quota < local_dc)) {
    iVar11 = iVar11 + -1;
    if (0 < quota) {
      if (((uint)drop_rule >> 8 & 1) == 0) {
        scopy_(&local_dc,(real *)((long)local_a0 + (long)iVar21 * 4),&local_8c,work,&local_8c);
        fVar28 = sqselect(local_dc,work,quota);
        iVar21 = piVar20[lVar18];
      }
      else {
        auVar4._4_4_ = fVar28;
        auVar4._0_4_ = fVar22;
        auVar4._8_4_ = uVar29;
        auVar4._12_4_ = uVar30;
        auVar24 = divps(_DAT_0011b680,auVar4);
        fVar28 = 1.0 / (((float)quota * (auVar24._0_4_ - auVar24._4_4_)) / (float)local_dc +
                       auVar24._4_4_);
      }
    }
    if (iVar21 <= iVar11) {
      lVar7 = (long)iVar21;
      do {
        fVar22 = *(float *)((long)local_a0 + lVar7 * 4);
        lVar13 = (long)iVar11 << 0x20;
        lVar15 = (long)iVar11 + 1;
        while (ABS(fVar22) <= fVar28) {
          if ((milu - SMILU_1 < 2) || (fVar22 = ABS(fVar22), milu == SMILU_3)) {
            *sum = fVar22 + *sum;
          }
          fVar22 = *(float *)((long)local_a0 + lVar15 * 4 + -4);
          *(float *)((long)local_a0 + lVar7 * 4) = fVar22;
          piVar17[lVar7] = piVar17[lVar15 + -1];
          local_dc = local_dc + -1;
          piVar20[lVar18 + 1] = piVar20[lVar18 + 1] + -1;
          lVar13 = lVar13 + -0x100000000;
          iVar11 = iVar11 + -1;
          lVar15 = lVar15 + -1;
          if (lVar15 <= lVar7) goto LAB_0010ca7c;
        }
        bVar3 = lVar7 < lVar13 >> 0x20;
        lVar7 = lVar7 + 1;
      } while (bVar3);
    }
  }
LAB_0010ca7c:
  if (milu == SMILU_2) {
    *sum = ABS(*sum);
  }
  *nnzUj = *nnzUj + local_dc;
  return 0;
}

Assistant:

int
ilu_scopy_to_ucol(
	      int	 jcol,	   /* in */
	      int	 nseg,	   /* in */
	      int	 *segrep,  /* in */
	      int	 *repfnz,  /* in */
	      int	 *perm_r,  /* in */
	      float	 *dense,   /* modified - reset to zero on return */
	      int  	 drop_rule,/* in */
	      milu_t	 milu,	   /* in */
	      double	 drop_tol, /* in */
	      int	 quota,    /* maximum nonzero entries allowed */
	      float	 *sum,	   /* out - the sum of dropped entries */
	      int	 *nnzUj,   /* in - out */
	      GlobalLU_t *Glu,	   /* modified */
	      float	 *work	   /* working space with minimum size n,
				    * used by the second dropping rule */
	      )
{
/*
 * Gather from SPA dense[*] to global ucol[*].
 */
    int       ksub, krep, ksupno, kfnz, segsze;
    int       i, k; 
    int       fsupc, isub, irow;
    int       jsupno;
    int_t     new_next, nextu, mem_error;
    int       *xsup, *supno;
    int_t     *lsub, *xlsub;
    float    *ucol;
    int_t     *usub, *xusub;
    int_t     nzumax;
    int       m; /* number of entries in the nonzero U-segments */
    register float d_max = 0.0, d_min = 1.0 / smach("Safe minimum");
    register double tmp;
    float zero = 0.0;
    int i_1 = 1;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    ucol    = (float *) Glu->ucol;
    usub    = Glu->usub;
    xusub   = Glu->xusub;
    nzumax  = Glu->nzumax;

    *sum = zero;
    if (drop_rule == NODROP) {
	drop_tol = -1.0, quota = Glu->n;
    }

    jsupno = supno[jcol];
    nextu  = xusub[jcol];
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {
	krep = segrep[k--];
	ksupno = supno[krep];

	if ( ksupno != jsupno ) { /* Should go into ucol[] */
	    kfnz = repfnz[krep];
	    if ( kfnz != SLU_EMPTY ) {	/* Nonzero U-segment */

		fsupc = xsup[ksupno];
		isub = xlsub[fsupc] + kfnz - fsupc;
		segsze = krep - kfnz + 1;

		new_next = nextu + segsze;
		while ( new_next > nzumax ) {
		    if ((mem_error = sLUMemXpand(jcol, nextu, UCOL, &nzumax,
			    Glu)) != 0)
			return (mem_error);
		    ucol = Glu->ucol;
		    if ((mem_error = sLUMemXpand(jcol, nextu, USUB, &nzumax,
			    Glu)) != 0)
			return (mem_error);
		    usub = Glu->usub;
		    lsub = Glu->lsub;
		}

		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub++];
		    tmp = fabs(dense[irow]);

		    /* first dropping rule */
		    if (quota > 0 && tmp >= drop_tol) {
			if (tmp > d_max) d_max = tmp;
			if (tmp < d_min) d_min = tmp;
			usub[nextu] = perm_r[irow];
			ucol[nextu] = dense[irow];
			nextu++;
		    } else {
			switch (milu) {
			    case SMILU_1:
			    case SMILU_2:
				*sum += dense[irow];
				break;
			    case SMILU_3:
				/* *sum += fabs(dense[irow]);*/
				*sum += tmp;
				break;
			    case SILU:
			    default:
				break;
			}
#ifdef DEBUG
			num_drop_U++;
#endif
		    }
		    dense[irow] = zero;
		}

	    }

	}

    } /* for each segment... */

    xusub[jcol + 1] = nextu;	  /* Close U[*,jcol] */
    m = xusub[jcol + 1] - xusub[jcol];

    /* second dropping rule */
    if (drop_rule & DROP_SECONDARY && m > quota) {
	register double tol = d_max;
	register int m0 = xusub[jcol] + m - 1;

	if (quota > 0) {
	    if (drop_rule & DROP_INTERP) {
		d_max = 1.0 / d_max; d_min = 1.0 / d_min;
		tol = 1.0 / (d_max + (d_min - d_max) * quota / m);
	    } else {
		scopy_(&m, &ucol[xusub[jcol]], &i_1, work, &i_1);
		tol = sqselect(m, work, quota);
#if 0
		A = &ucol[xusub[jcol]];
		for (i = 0; i < m; i++) work[i] = i;
		qsort(work, m, sizeof(int), _compare_);
		tol = fabs(usub[xusub[jcol] + work[quota]]);
#endif
	    }
	}
	for (i = xusub[jcol]; i <= m0; ) {
	    if (fabs(ucol[i]) <= tol) {
		switch (milu) {
		    case SMILU_1:
		    case SMILU_2:
			*sum += ucol[i];
			break;
		    case SMILU_3:
			*sum += fabs(ucol[i]);
			break;
		    case SILU:
		    default:
			break;
		}
		ucol[i] = ucol[m0];
		usub[i] = usub[m0];
		m0--;
		m--;
#ifdef DEBUG
		num_drop_U++;
#endif
		xusub[jcol + 1]--;
		continue;
	    }
	    i++;
	}
    }

    if (milu == SMILU_2) *sum = fabs(*sum);

    *nnzUj += m;

    return 0;
}